

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall ON_BinaryArchive::Read3dmGroup(ON_BinaryArchive *this,ON_Group **ppGroup)

{
  bool bVar1;
  int iVar2;
  ON_Object *local_40;
  ON_Object *p;
  ON_Group *group;
  ON__INT64 big_value;
  ON_Group **ppOStack_20;
  ON__UINT32 tcode;
  ON_Group **ppGroup_local;
  ON_BinaryArchive *this_local;
  
  ppOStack_20 = ppGroup;
  ppGroup_local = (ON_Group **)this;
  bVar1 = Read3dmTableRecord(this,group_table,ppGroup);
  if (bVar1) {
    big_value._4_4_ = 0;
    group = (ON_Group *)0x0;
    p = (ON_Object *)0x0;
    bVar1 = BeginRead3dmBigChunk(this,(uint *)((long)&big_value + 4),(ON__INT64 *)&group);
    if (bVar1) {
      if (big_value._4_4_ == 0x20008073) {
        Internal_Increment3dmTableItemCount(this);
        local_40 = (ON_Object *)0x0;
        iVar2 = ReadObject(this,&local_40);
        if (iVar2 != 0) {
          p = (ON_Object *)ON_Group::Cast(local_40);
          if ((ON_ModelComponent *)p == (ON_ModelComponent *)0x0) {
            if (local_40 != (ON_Object *)0x0) {
              (*local_40->_vptr_ON_Object[4])();
            }
          }
          else {
            Internal_Read3dmUpdateManifest(this,(ON_ModelComponent *)p);
          }
        }
        if (p == (ON_Object *)0x0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x28dc,"","ON_BinaryArchive::Read3dmGroup() - corrupt group table");
        }
      }
      else if (big_value._4_4_ != -1) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x28e0,"","ON_BinaryArchive::Read3dmGroup() - corrupt group table");
      }
      EndRead3dmChunk(this);
    }
    *ppOStack_20 = (ON_Group *)p;
    this_local._4_4_ = (uint)(p != (ON_Object *)0x0);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_BinaryArchive::Read3dmGroup( ON_Group** ppGroup )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::group_table, (void**)ppGroup))
    return 0;

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  ON_Group* group = nullptr;
  if ( BeginRead3dmBigChunk( &tcode, &big_value ) ) 
  {
    if ( tcode == TCODE_GROUP_RECORD ) 
    {
     Internal_Increment3dmTableItemCount();
      ON_Object* p = 0;
      if ( ReadObject( &p ) ) {
        group = ON_Group::Cast(p);
        if (!group)
          delete p;
        else
          Internal_Read3dmUpdateManifest(*group);
      }
      if (!group) {
        ON_ERROR("ON_BinaryArchive::Read3dmGroup() - corrupt group table");
      }
    }
    else if ( tcode != TCODE_ENDOFTABLE ) {
      ON_ERROR("ON_BinaryArchive::Read3dmGroup() - corrupt group table");
    }
    EndRead3dmChunk();
  }
  *ppGroup = group;
  return (group) ? 1 : 0;
}